

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O1

void __thiscall fmcalc::init_policytc(fmcalc *this,int maxRunLevel)

{
  int iVar1;
  fm_policyTC *f_00;
  vector<fm_policyTC,_std::allocator<fm_policyTC>_> p;
  fm_policyTC f;
  vector<fm_policyTC,_std::allocator<fm_policyTC>_> local_48;
  fm_policyTC local_28;
  
  if (maxRunLevel != -1) {
    this->maxRunLevel_ = maxRunLevel;
  }
  local_48.super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>._M_impl.
  super__Vector_impl_data._M_start = (fm_policyTC *)0x0;
  local_48.super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>._M_impl.
  super__Vector_impl_data._M_finish = (fm_policyTC *)0x0;
  local_48.super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parse_policytc(this,&local_48);
  local_28.layer_id = 1;
  local_28.profile_id = -1;
  local_28.level_id = 0;
  f_00 = local_48.super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>._M_impl.
         super__Vector_impl_data._M_start;
  if (0 < *(this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start) {
    iVar1 = 0;
    do {
      iVar1 = iVar1 + 1;
      local_28.agg_id = iVar1;
      addtcrow(this,&local_28);
      f_00 = local_48.super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>._M_impl.
             super__Vector_impl_data._M_start;
    } while (iVar1 < *(this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  }
  for (; f_00 != local_48.super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>._M_impl.
                 super__Vector_impl_data._M_finish; f_00 = f_00 + 1) {
    addtcrow(this,f_00);
  }
  if (local_48.super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>._M_impl.
      super__Vector_impl_data._M_start != (fm_policyTC *)0x0) {
    operator_delete(local_48.super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void fmcalc::init_policytc(int maxRunLevel)
{
	if (maxRunLevel != -1) maxRunLevel_ = maxRunLevel;

	std::vector< fm_policyTC> p;
	parse_policytc(p);

	fm_policyTC f;
	f.layer_id = 1;
	f.level_id = 0;
	f.profile_id = -1;
	for (int i = 1; i <= level_to_maxagg_id_[0]; i++) {		
		f.agg_id = i;		
		addtcrow(f);
	}


	auto iter = p.begin();
	while (iter != p.end()) {
		addtcrow(*iter);
		iter++;
	}

}